

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::RgbaOutputFile::ToYca::setFrameBuffer(ToYca *this,Rgba *base,size_t xStride,size_t yStride)

{
  undefined1 in_R10B;
  FrameBuffer fb;
  Slice local_58;
  
  if (this->_fbBase == (Rgba *)0x0) {
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (this->_writeY == true) {
      Slice::Slice(&local_58,HALF,(char *)&this->_tmpBuf[-(long)this->_xMin].g,8,0,1,1,0.0,
                   (bool)in_R10B,SUB81(this->_tmpBuf,0));
      FrameBuffer::insert(&fb,"Y",&local_58);
    }
    if (this->_writeC == true) {
      Slice::Slice(&local_58,HALF,(char *)(this->_tmpBuf + -(long)this->_xMin),0x10,0,2,2,0.0,
                   (bool)in_R10B,(bool)((char)this->_xMin * '\b'));
      FrameBuffer::insert(&fb,"RY",&local_58);
      Slice::Slice(&local_58,HALF,(char *)&this->_tmpBuf[-(long)this->_xMin].b,0x10,0,2,2,0.0,
                   (bool)in_R10B,SUB81(this->_tmpBuf,0));
      FrameBuffer::insert(&fb,"BY",&local_58);
    }
    if (this->_writeA == true) {
      Slice::Slice(&local_58,HALF,(char *)&this->_tmpBuf[-(long)this->_xMin].a,8,0,1,1,0.0,
                   (bool)in_R10B,SUB81(this->_tmpBuf,0));
      FrameBuffer::insert(&fb,"A",&local_58);
    }
    OutputFile::setFrameBuffer(this->_outputFile,&fb);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&fb);
  }
  this->_fbBase = base;
  this->_fbXStride = xStride;
  this->_fbYStride = yStride;
  return;
}

Assistant:

void
RgbaOutputFile::ToYca::setFrameBuffer (const Rgba *base,
				       size_t xStride,
				       size_t yStride)
{
    if (_fbBase == 0)
    {
	FrameBuffer fb;

	if (_writeY)
	{
	    fb.insert ("Y",
		       Slice (HALF,				// type
			      (char *) &_tmpBuf[-_xMin].g,	// base
			      sizeof (Rgba),			// xStride
			      0,				// yStride
			      1,				// xSampling
			      1));				// ySampling
	}

	if (_writeC)
	{
	    fb.insert ("RY",
		       Slice (HALF,				// type
			      (char *) &_tmpBuf[-_xMin].r,	// base
			      sizeof (Rgba) * 2,		// xStride
			      0,				// yStride
			      2,				// xSampling
			      2));				// ySampling

	    fb.insert ("BY",
		       Slice (HALF,				// type
			      (char *) &_tmpBuf[-_xMin].b,	// base
			      sizeof (Rgba) * 2,		// xStride
			      0,				// yStride
			      2,				// xSampling
			      2));				// ySampling
	}

	if (_writeA)
	{
	    fb.insert ("A",
		       Slice (HALF,				// type
			      (char *) &_tmpBuf[-_xMin].a,	// base
			      sizeof (Rgba),			// xStride
			      0,				// yStride
			      1,				// xSampling
			      1));				// ySampling
	}

	_outputFile.setFrameBuffer (fb);
    }

    _fbBase = base;
    _fbXStride = xStride;
    _fbYStride = yStride;
}